

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O1

void lexer_error(char *m,char *s,uint row,uint col)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  void *__s;
  void *__s_00;
  undefined8 uStack_50;
  undefined8 local_48;
  char *local_40;
  uint local_34;
  
  uStack_50 = 0x102ec3;
  local_48 = s;
  local_40 = m;
  local_34 = row;
  sVar3 = strlen(s);
  uVar4 = (ulong)(col + 2) + 0xf & 0xfffffffffffffff0;
  lVar1 = -uVar4;
  __s_00 = (void *)((long)&local_48 + lVar1);
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x102eeb;
  memset(__s_00,0,(ulong)(col + 2));
  *(undefined1 *)((long)&local_48 - uVar4) = 10;
  uVar4 = (ulong)col;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x102f04;
  memset((void *)((long)&local_48 + lVar1 + 1),0x20,uVar4);
  *(undefined1 *)(uVar4 + (long)__s_00) = 0x5e;
  __s = (void *)((long)__s_00 - (uVar4 + 0xf & 0xfffffffffffffff0));
  if (sVar3 < uVar4) {
    *(undefined8 *)((long)__s + -8) = 0x102f35;
    memset(__s,0x20,(uVar4 - sVar3) + 1);
  }
  pcVar2 = local_40;
  uVar4 = (ulong)local_34;
  *(undefined8 *)((long)__s + -8) = 0x102f57;
  fprintf(_stderr,"%s:(%d, %d)\n",pcVar2,uVar4,(ulong)col);
  pcVar2 = local_48;
  *(undefined8 *)((long)__s + -8) = 0x102f72;
  fprintf(_stderr,"%s%s%s\n",__s,pcVar2,__s_00);
  *(code **)((long)__s + -8) = parser_error;
  exit(1);
}

Assistant:

void lexer_error(const char *m, const char *s, unsigned int row, unsigned int col) {
    size_t len = strlen(s);
    char buff[col + 2];
    memset(buff, '\0', col + 2);
    memset(buff, '\n', 1);
    memset(buff + 1, ' ', col);
    memset(buff + col, '^', 1);
    char n_buff[col];
    if (col > len) {
        memset(n_buff, ' ', col - len + 1);
    }
    fprintf(stderr, "%s:(%d, %d)\n", m, row, col);
    fprintf(stderr, "%s%s%s\n", n_buff, s, buff);
    exit(1);
}